

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O1

void WebRtcIsac_AutoCorr(double *r,double *x,size_t N,size_t order)

{
  long lVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  lVar1 = 0;
  pdVar2 = x;
  do {
    dVar4 = *x * x[lVar1];
    dVar5 = 0.0;
    if (1 < N - lVar1) {
      uVar3 = 1;
      do {
        dVar5 = dVar5 + dVar4;
        dVar4 = x[uVar3] * pdVar2[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < N - lVar1);
    }
    r[lVar1] = dVar5 + dVar4;
    lVar1 = lVar1 + 1;
    pdVar2 = pdVar2 + 1;
  } while (lVar1 != order + 1 + (ulong)(order == 0xffffffffffffffff));
  return;
}

Assistant:

void WebRtcIsac_AutoCorr(double* r, const double* x, size_t N, size_t order) {
  size_t  lag, n;
  double sum, prod;
  const double *x_lag;

  for (lag = 0; lag <= order; lag++)
  {
    sum = 0.0f;
    x_lag = &x[lag];
    prod = x[0] * x_lag[0];
    for (n = 1; n < N - lag; n++) {
      sum += prod;
      prod = x[n] * x_lag[n];
    }
    sum += prod;
    r[lag] = sum;
  }

}